

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

int32_t uhash_puti_63(UHashtable *hash,void *key,int32_t value,UErrorCode *status)

{
  UHashTok UVar1;
  
  UVar1._4_4_ = 0;
  UVar1.integer = value;
  UVar1 = _uhash_put(hash,key,UVar1,'\x01',status);
  return UVar1._0_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uhash_puti(UHashtable *hash,
           void* key,
           int32_t value,
           UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.pointer = key;
    valueholder.integer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      HINT_KEY_POINTER,
                      status).integer;
}